

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitors.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  GLFWmonitor **ppGVar2;
  GLFWmonitor **monitors;
  int mode;
  int count;
  int i;
  int ch;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  monitors._0_4_ = 0;
  _i = argv;
  argv_local._0_4_ = argc;
  while( true ) {
    count = getopt((int)argv_local,_i,"th");
    if (count == -1) {
      glfwSetErrorCallback(error_callback);
      iVar1 = glfwInit();
      if (iVar1 != 0) {
        ppGVar2 = glfwGetMonitors((int *)((long)&monitors + 4));
        for (mode = 0; mode < monitors._4_4_; mode = mode + 1) {
          if ((int)monitors == 0) {
            list_modes(ppGVar2[mode]);
          }
          else if ((int)monitors == 1) {
            test_modes(ppGVar2[mode]);
          }
        }
        glfwTerminate();
        exit(0);
      }
      exit(1);
    }
    if (count == 0x68) break;
    if (count != 0x74) {
      usage();
      exit(1);
    }
    monitors._0_4_ = 1;
    count = 0x74;
  }
  usage();
  exit(0);
}

Assistant:

int main(int argc, char** argv)
{
    int ch, i, count, mode = LIST_MODE;
    GLFWmonitor** monitors;

    while ((ch = getopt(argc, argv, "th")) != -1)
    {
        switch (ch)
        {
            case 'h':
                usage();
                exit(EXIT_SUCCESS);
            case 't':
                mode = TEST_MODE;
                break;
            default:
                usage();
                exit(EXIT_FAILURE);
        }
    }

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    monitors = glfwGetMonitors(&count);

    for (i = 0;  i < count;  i++)
    {
        if (mode == LIST_MODE)
            list_modes(monitors[i]);
        else if (mode == TEST_MODE)
            test_modes(monitors[i]);
    }

    glfwTerminate();
    exit(EXIT_SUCCESS);
}